

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# const_merge.hpp
# Opt level: O0

void __thiscall optimization::const_merge::Env::Env(Env *this,MirFunction *func)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  size_type sVar4;
  pointer pIVar5;
  char *pcVar6;
  uint extraout_EDX;
  uint extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  long in_RSI;
  pointer_____offset_0x10___ *__s;
  long *in_RDI;
  undefined1 auVar7 [12];
  undefined1 auVar8 [12];
  VarId var_1;
  VarId var;
  OpInst *opInst;
  VarId srcid;
  AssignInst *assignInst;
  Inst *is;
  value_type *inst;
  int i;
  pair<const_int,_mir::inst::BasicBlk> *blkpair;
  iterator __end2;
  iterator __begin2;
  map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
  *__range2;
  VarId *in_stack_fffffffffffffea8;
  VarId *in_stack_fffffffffffffeb0;
  long local_128;
  long local_f8;
  uint32_t in_stack_ffffffffffffff40;
  LabelId in_stack_ffffffffffffff44;
  Displayable in_stack_ffffffffffffff48;
  Env *in_stack_ffffffffffffff50;
  pointer_____offset_0x10___ local_a8 [4];
  long local_88;
  long local_60;
  type local_48;
  reference local_40;
  int local_34;
  reference local_30;
  _Self local_28;
  _Self local_20;
  long local_18;
  long local_10;
  
  *in_RDI = in_RSI;
  local_10 = in_RSI;
  std::
  map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
  ::map((map<mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>,_std::less<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>_>_>
         *)0x19b483);
  local_18 = local_10 + 0x68;
  local_20._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::begin((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
                *)in_stack_fffffffffffffea8);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
       ::end((map<int,_mir::inst::BasicBlk,_std::less<int>,_std::allocator<std::pair<const_int,_mir::inst::BasicBlk>_>_>
              *)in_stack_fffffffffffffea8);
  while (bVar1 = std::operator!=(&local_20,&local_28), bVar1) {
    local_30 = std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator*
                         ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)0x19b4ec)
    ;
    for (local_34 = 0; uVar3 = (ulong)local_34,
        sVar4 = std::
                vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                ::size(&(local_30->second).inst), uVar3 < sVar4; local_34 = local_34 + 1) {
      __s = (pointer_____offset_0x10___ *)(long)local_34;
      local_40 = std::
                 vector<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>,_std::allocator<std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>_>_>
                 ::operator[](&(local_30->second).inst,(size_type)__s);
      local_48 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator*
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            in_stack_fffffffffffffeb0);
      pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                         ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                          0x19b575);
      iVar2 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
      if (iVar2 == 0) {
        if (local_48 == (type)0x0) {
          auVar7._4_8_ = 0;
          auVar7._0_4_ = extraout_EDX;
          auVar7 = auVar7 << 0x40;
        }
        else {
          __s = &mir::inst::Inst::typeinfo;
          auVar7 = __dynamic_cast(local_48,&mir::inst::Inst::typeinfo,
                                  &mir::inst::AssignInst::typeinfo,0);
        }
        local_f8 = auVar7._0_8_;
        local_60 = local_f8;
        pcVar6 = std::variant<int,_mir::inst::VarId>::index
                           ((variant<int,_mir::inst::VarId> *)(local_f8 + 0x20),(char *)__s,
                            auVar7._8_4_);
        if (pcVar6 == (char *)0x1) {
          std::get<mir::inst::VarId,int,mir::inst::VarId>
                    ((variant<int,_mir::inst::VarId> *)0x19b632);
          mir::inst::VarId::VarId(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          mir::inst::VarId::VarId(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
          add_usepoint(in_stack_ffffffffffffff50,
                       (VarId *)in_stack_ffffffffffffff48._vptr_Displayable,
                       in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
        }
      }
      else {
        pIVar5 = std::unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_>::operator->
                           ((unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *)
                            0x19b6a0);
        iVar2 = (*(pIVar5->super_Displayable)._vptr_Displayable[1])();
        if (iVar2 == 1) {
          if (local_48 == (type)0x0) {
            auVar8._4_8_ = 0;
            auVar8._0_4_ = extraout_EDX_00;
            auVar8 = auVar8 << 0x40;
          }
          else {
            __s = &mir::inst::Inst::typeinfo;
            auVar8 = __dynamic_cast(local_48,&mir::inst::Inst::typeinfo,&mir::inst::OpInst::typeinfo
                                    ,0);
          }
          local_128 = auVar8._0_8_;
          local_88 = local_128;
          pcVar6 = std::variant<int,_mir::inst::VarId>::index
                             ((variant<int,_mir::inst::VarId> *)(local_128 + 0x20),(char *)__s,
                              auVar8._8_4_);
          iVar2 = extraout_EDX_01;
          if (pcVar6 == (char *)0x1) {
            std::get<mir::inst::VarId,int,mir::inst::VarId>
                      ((variant<int,_mir::inst::VarId> *)0x19b737);
            mir::inst::VarId::VarId(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            __s = local_a8;
            mir::inst::VarId::VarId(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            add_usepoint(in_stack_ffffffffffffff50,
                         (VarId *)in_stack_ffffffffffffff48._vptr_Displayable,
                         in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
            iVar2 = extraout_EDX_02;
          }
          pcVar6 = std::variant<int,_mir::inst::VarId>::index
                             ((variant<int,_mir::inst::VarId> *)(local_88 + 0x40),(char *)__s,iVar2)
          ;
          if (pcVar6 == (char *)0x1) {
            std::get<mir::inst::VarId,int,mir::inst::VarId>
                      ((variant<int,_mir::inst::VarId> *)0x19b7bf);
            in_stack_fffffffffffffea8 = (VarId *)&stack0xffffffffffffff48;
            mir::inst::VarId::VarId(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            in_stack_fffffffffffffeb0 = (VarId *)&stack0xffffffffffffff38;
            mir::inst::VarId::VarId(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
            add_usepoint(in_stack_ffffffffffffff50,
                         (VarId *)in_stack_ffffffffffffff48._vptr_Displayable,
                         in_stack_ffffffffffffff44,in_stack_ffffffffffffff40);
          }
        }
      }
    }
    std::_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_>::operator++
              ((_Rb_tree_iterator<std::pair<const_int,_mir::inst::BasicBlk>_> *)
               in_stack_fffffffffffffeb0);
  }
  return;
}

Assistant:

Env(mir::inst::MirFunction& func) : func(func) {
    for (auto& blkpair : func.basic_blks) {
      for (int i = 0; i < blkpair.second.inst.size(); i++) {
        auto& inst = blkpair.second.inst[i];
        auto& is = *inst;
        if (inst->inst_kind() == mir::inst::InstKind::Assign) {
          auto assignInst = dynamic_cast<mir::inst::AssignInst*>(&is);
          if (assignInst->src.index() == 1) {
            auto srcid = std::get<mir::inst::VarId>(assignInst->src);
            add_usepoint(srcid, blkpair.first, i);
          }
        } else if (inst->inst_kind() == mir::inst::InstKind::Op) {
          auto opInst = dynamic_cast<mir::inst::OpInst*>(&is);
          if (opInst->lhs.index() == 1) {
            auto var = std::get<mir::inst::VarId>(opInst->lhs);
            add_usepoint(var, blkpair.first, i);
          }
          if (opInst->rhs.index() == 1) {
            auto var = std::get<mir::inst::VarId>(opInst->rhs);
            add_usepoint(var, blkpair.first, i);
          }
        }
      }
    }
  }